

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O2

void __thiscall
wabt::AST::Construct(AST *this,ExprList *es,Index nresults,Index nparams,bool is_function_body)

{
  pointer pNVar1;
  pointer pNVar2;
  pointer puVar3;
  back_insert_iterator<std::vector<wabt::Node,_std::allocator<wabt::Node>_>_> this_00;
  bool bVar4;
  Index IVar5;
  reference e;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  undefined7 in_register_00000081;
  int iVar10;
  byte bVar11;
  const_iterator rhs;
  Arities AVar12;
  reference rVar13;
  int num_vals;
  back_insert_iterator<std::vector<wabt::Node,_std::allocator<wabt::Node>_>_> local_d0;
  undefined4 local_c8;
  int num_vars;
  vector<bool,_std::allocator<bool>_> *local_c0;
  ulong local_b8;
  ulong local_b0;
  ExprList *local_a8;
  anon_class_16_2_0af2ad8c GenFlushedVars;
  anon_class_16_2_c2519580 MoveStatementsBelowVars;
  anon_class_16_2_c25194c6 GenFlushVars;
  const_iterator __begin2;
  type void_exp;
  
  local_c8 = (undefined4)CONCAT71(in_register_00000081,is_function_body);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&this->block_stack,&this->cur_block_id);
  local_c0 = &this->blocks_closed;
  this->cur_block_id =
       (ulong)(this->blocks_closed).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
       ((long)(this->blocks_closed).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
       (long)(this->blocks_closed).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
  bVar11 = 0;
  std::vector<bool,_std::allocator<bool>_>::push_back(local_c0,false);
  local_d0.container = &this->exp_stack;
  local_b0 = (long)(this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  local_b8 = (long)local_b0 / 0x30;
  iVar10 = this->value_stack_depth;
  iVar9 = iVar10 - nparams;
  __begin2.node_ = es->first_;
  local_a8 = es;
  __begin2.list_ = es;
  do {
    rhs.node_ = (Expr *)0x0;
    rhs.list_ = local_a8;
    bVar4 = intrusive_list<wabt::Expr>::const_iterator::operator!=(&__begin2,rhs);
    if (!bVar4) {
      if (((bVar11 & 1) == 0) && (this->value_stack_depth - iVar9 != nresults)) {
        __assert_fail("unreachable || value_stack_depth - value_stack_depth_start == static_cast<int>(nresults)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/decompiler-ast.h"
                      ,0x142,"void wabt::AST::Construct(const ExprList &, Index, Index, bool)");
      }
      this->value_stack_depth = iVar9;
      pNVar1 = (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl
               .super__Vector_impl_data._M_start;
      pNVar2 = (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl
               .super__Vector_impl_data._M_finish;
      uVar6 = (long)pNVar2 - (long)pNVar1;
      if (uVar6 < local_b0) {
        __assert_fail("end >= start",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/decompiler-ast.h"
                      ,0x147,"void wabt::AST::Construct(const ExprList &, Index, Index, bool)");
      }
      if ((char)local_c8 != '\0') {
        if (pNVar1 != pNVar2) {
          if (pNVar2[-1].etype == Return) {
            if (pNVar2[-1].children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                pNVar2[-1].children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              std::vector<wabt::Node,_std::allocator<wabt::Node>_>::pop_back(local_d0.container);
            }
          }
          else if (nresults != 0) {
            InsertNode(this,EndReturn,Nop,(Expr *)0x0,nresults);
          }
        }
        std::__copy_move<true,false,std::random_access_iterator_tag>::
        __copy_m<wabt::Node*,std::back_insert_iterator<std::vector<wabt::Node,std::allocator<wabt::Node>>>>
                  ((this->predecls).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (this->predecls).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                   _M_impl.super__Vector_impl_data._M_finish,local_d0);
        pNVar1 = (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        std::_V2::
        __rotate<__gnu_cxx::__normal_iterator<wabt::Node*,std::vector<wabt::Node,std::allocator<wabt::Node>>>>
                  ((this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   pNVar1 + ((long)(this->predecls).
                                   super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->predecls).
                                  super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                                  _M_impl.super__Vector_impl_data._M_start) / -0x30,pNVar1);
        std::vector<wabt::Node,_std::allocator<wabt::Node>_>::clear(&this->predecls);
        uVar6 = (long)(this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                      _M_impl.super__Vector_impl_data._M_start;
      }
      lVar7 = (long)uVar6 / 0x30 - local_b8;
      if (local_b8 <= (ulong)((long)uVar6 / 0x30)) {
        if (lVar7 != 1) {
          InsertNode(this,Statements,Nop,(Expr *)0x0,(Index)lVar7);
        }
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](local_c0,this->cur_block_id);
        *rVar13._M_p = *rVar13._M_p | rVar13._M_mask;
        puVar3 = (this->block_stack).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        this->cur_block_id = puVar3[-1];
        (this->block_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar3 + -1;
        return;
      }
      __assert_fail("end >= start",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/decompiler-ast.h"
                    ,0x161,"void wabt::AST::Construct(const ExprList &, Index, Index, bool)");
    }
    e = intrusive_list<wabt::Expr>::const_iterator::operator*(&__begin2);
    Construct(this,e);
    AVar12 = ModuleContext::GetExprArity(this->mc,e);
    iVar8 = this->value_stack_depth - AVar12.nargs;
    this->value_stack_depth = iVar8;
    if (iVar8 < iVar10) {
      iVar10 = iVar8;
    }
    bVar11 = bVar11 | AVar12.unreachable;
    if (((bVar11 & 1) == 0) && (iVar8 < iVar9)) {
      __assert_fail("unreachable || value_stack_depth >= value_stack_depth_start",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/decompiler-ast.h"
                    ,0xe8,"void wabt::AST::Construct(const ExprList &, Index, Index, bool)");
    }
    uVar6 = AVar12._0_8_ >> 0x20;
    IVar5 = AVar12.nreturns;
    iVar8 = iVar8 + IVar5;
    this->value_stack_depth = iVar8;
    if (uVar6 == 1) {
      iVar10 = iVar10 + (uint)(iVar8 + -1 == iVar10 && e->type_ == Const);
    }
    else {
      num_vars = iVar10 - iVar9;
      num_vals = iVar8 - iVar10;
      GenFlushedVars.num_vals = &num_vals;
      MoveStatementsBelowVars.num_vars = &num_vars;
      GenFlushedVars.this = this;
      MoveStatementsBelowVars.this = this;
      GenFlushVars.this = this;
      GenFlushVars.num_vals = GenFlushedVars.num_vals;
      if ((uVar6 == 0) && (iVar9 < iVar8)) {
        if (num_vals < 1) {
          pNVar1 = (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          std::_V2::
          __rotate<__gnu_cxx::__normal_iterator<wabt::Node*,std::vector<wabt::Node,std::allocator<wabt::Node>>>>
                    (pNVar1 + (-1 - (long)num_vars),pNVar1 + -1);
        }
        else {
          Node::Node(&void_exp,
                     (this->exp_stack).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                     _M_impl.super__Vector_impl_data._M_finish + -1);
          this_00.container = (vector<wabt::Node,_std::allocator<wabt::Node>_> *)local_d0;
          std::vector<wabt::Node,_std::allocator<wabt::Node>_>::pop_back(local_d0.container);
          Construct::anon_class_16_2_c25194c6::operator()(&GenFlushVars,num_vals);
          std::vector<wabt::Node,_std::allocator<wabt::Node>_>::emplace_back<wabt::Node>
                    (this_00.container,&void_exp);
          Construct::anon_class_16_2_c2519580::operator()(&MoveStatementsBelowVars,2);
          Construct::anon_class_16_2_0af2ad8c::operator()(&GenFlushedVars);
          std::vector<wabt::Node,_std::allocator<wabt::Node>_>::~vector(&void_exp.children);
        }
      }
      else {
        if (uVar6 == 0) goto LAB_00166b6f;
        if (num_vals < (int)IVar5) {
          __assert_fail("num_vals >= static_cast<int>(arity.nreturns)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/decompiler-ast.h"
                        ,299,"void wabt::AST::Construct(const ExprList &, Index, Index, bool)");
        }
        Construct::anon_class_16_2_c25194c6::operator()(&GenFlushVars,(num_vals - IVar5) + 1);
        Construct::anon_class_16_2_c2519580::operator()(&MoveStatementsBelowVars,1);
        Construct::anon_class_16_2_0af2ad8c::operator()(&GenFlushedVars);
      }
      iVar10 = this->value_stack_depth;
    }
LAB_00166b6f:
    intrusive_list<wabt::Expr>::const_iterator::operator++(&__begin2);
  } while( true );
}

Assistant:

void Construct(const ExprList& es, Index nresults, Index nparams, bool is_function_body) {
    block_stack.push_back(cur_block_id);
    cur_block_id = blocks_closed.size();
    blocks_closed.push_back(false);
    auto start = exp_stack.size();
    int value_stack_depth_start = value_stack_depth - nparams;
    auto value_stack_in_variables = value_stack_depth;
    bool unreachable = false;
    for (auto& e : es) {
      Construct(e);
      auto arity = mc.GetExprArity(e);
      value_stack_depth -= arity.nargs;
      value_stack_in_variables = std::min(value_stack_in_variables,
                                          value_stack_depth);
      unreachable = unreachable || arity.unreachable;
      assert(unreachable || value_stack_depth >= value_stack_depth_start);
      value_stack_depth += arity.nreturns;
      // We maintain the invariant that a value_stack_depth of N is represented
      // by the last N exp_stack items (each of which returning exactly 1
      // value), all exp_stack items before it return void ("statements").
      // In particular for the wasm stack:
      // - The values between 0 and value_stack_depth_start are part of the
      //   parent block, and not touched here.
      // - The values from there up to value_stack_in_variables are variables
      //   to be used, representing previous statements that flushed the
      //   stack into variables.
      // - Values on top of that up to value_stack_depth are exps returning
      //   a single value.
      // The code below maintains the above invariants. With this in place
      // code "falls into place" the way you expect it.
      if (arity.nreturns != 1) {
        auto num_vars = value_stack_in_variables - value_stack_depth_start;
        auto num_vals = value_stack_depth - value_stack_in_variables;
        auto GenFlushVars = [&](int nargs) {
          auto& ftv = InsertNode(NodeType::FlushToVars, ExprType::Nop, nullptr,
                                 nargs);
          ftv.u.var_start = flushed_vars;
          ftv.u.var_count = num_vals;
        };
        auto MoveStatementsBelowVars = [&](size_t amount) {
          std::rotate(exp_stack.end() - num_vars - amount,
                      exp_stack.end() - amount,
                      exp_stack.end());
        };
        auto GenFlushedVars = [&]() {
          // Re-generate these values as vars.
          for (int i = 0; i < num_vals; i++) {
            auto& fv = InsertNode(NodeType::FlushedVar, ExprType::Nop, nullptr,
                                  0);
            fv.u.var_start = flushed_vars++;
            fv.u.var_count = 1;
          }
        };
        if (arity.nreturns == 0 &&
            value_stack_depth > value_stack_depth_start) {
          // We have a void item on top of the exp_stack, so we must "lift" the
          // previous values around it.
          // We track what part of the stack is in variables to avoid doing
          // this unnecessarily.
          if (num_vals > 0) {
            // We have actual new values that need lifting.
            // This puts the part of the stack that wasn't already a variable
            // (before the current void exp) into a FlushToVars.
            auto void_exp = std::move(exp_stack.back());
            exp_stack.pop_back();
            GenFlushVars(num_vals);
            exp_stack.push_back(std::move(void_exp));
            // Put this flush statement + void statement before any
            // existing variables.
            MoveStatementsBelowVars(2);
            // Now re-generate these values after the void exp as vars.
            GenFlushedVars();
          } else {
            // We have existing variables that need lifting, but no need to
            // create them anew.
            std::rotate(exp_stack.end() - num_vars - 1, exp_stack.end() - 1,
                        exp_stack.end());
          }
          value_stack_in_variables = value_stack_depth;
        } else if (arity.nreturns > 1) {
          // Multivalue: we flush the stack also.
          // Number of other non-variable values that may be present:
          assert(num_vals >= static_cast<int>(arity.nreturns));
          // Flush multi-value exp + others.
          GenFlushVars(num_vals - arity.nreturns + 1);
          // Put this flush statement before any existing variables.
          MoveStatementsBelowVars(1);
          GenFlushedVars();
          value_stack_in_variables = value_stack_depth;
        }
      } else {
        // Special optimisation: for constant instructions, we can mark these
        // as if they were variables, so they can be re-ordered for free with
        // the above code, without needing new variables!
        // TODO: this would be nice to also do for get_local and maybe others,
        // though that needs a way to ensure there's no set_local in between
        // when they get lifted, so complicates matters a bit.
        if (e.type() == ExprType::Const &&
            value_stack_in_variables == value_stack_depth - 1) {
          value_stack_in_variables++;
        }
      }
    }
    assert(unreachable ||
           value_stack_depth - value_stack_depth_start ==
           static_cast<int>(nresults));
    // Undo any changes to value_stack_depth, since parent takes care of arity
    // changes.
    value_stack_depth = value_stack_depth_start;
    auto end = exp_stack.size();
    assert(end >= start);
    if (is_function_body) {
      if (!exp_stack.empty()) {
        if (exp_stack.back().etype == ExprType::Return) {
          if (exp_stack.back().children.empty()) {
            // Return statement at the end of a void function.
            exp_stack.pop_back();
          }
        } else if (nresults) {
          // Combine nresults into a return statement, for when this is used as
          // a function body.
          // TODO: if this is some other kind of block and >1 value is being
          // returned, probably need some kind of syntax to make that clearer.
          InsertNode(NodeType::EndReturn, ExprType::Nop, nullptr, nresults);
        }
      }
      // TODO: these predecls are always at top level, but in the case of
      // use inside an exp, it be nice to do it in the current block. Can't
      // do that for predecls that are "out if scope" however.
      std::move(predecls.begin(), predecls.end(),
                std::back_inserter(exp_stack));
      std::rotate(exp_stack.begin(), exp_stack.end() - predecls.size(),
                  exp_stack.end());
      predecls.clear();
    }
    end = exp_stack.size();
    assert(end >= start);
    auto size = end - start;
    if (size != 1) {
      InsertNode(NodeType::Statements, ExprType::Nop, nullptr, size);
    }
    blocks_closed[cur_block_id] = true;
    cur_block_id = block_stack.back();
    block_stack.pop_back();
  }